

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycles.cpp
# Opt level: O0

void __thiscall Listener::doLoop(Listener *this,actor_ref *param_1,msg_loop *param_2)

{
  msg_loop local_29;
  actor_ref local_20;
  msg_loop *param_2_local;
  actor_ref *param_1_local;
  Listener *this_local;
  
  if (((this->super_actor).field_0x51 & 1) != 0) {
    this->m_counter = this->m_counter + 1;
    local_20.object_ = (object_t *)param_2;
    param_2_local = (msg_loop *)param_1;
    param_1_local = (actor_ref *)this;
    acto::actor::self((actor *)&stack0xffffffffffffffd8);
    acto::actor_ref::send<msg_loop>((actor_ref *)&stack0xffffffffffffffd8,&local_29);
    acto::actor_ref::~actor_ref((actor_ref *)&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

void doLoop(acto::actor_ref, const msg_loop&) {
    if (m_active) {
      m_counter++;
      // Продолжить цикл
      self().send(msg_loop());
    }
  }